

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O2

int source_segment_mix(mixed_segment *segment)

{
  byte bVar1;
  long *plVar2;
  mixed_pack *pmVar3;
  FILE *__stream;
  byte bVar4;
  int iVar5;
  uint32_t uVar6;
  char *pcVar7;
  uint32_t i;
  ulong uVar8;
  mixed_channel_t c;
  ulong uVar9;
  uint uVar10;
  float *pfVar11;
  ulong uVar12;
  float fVar13;
  uint32_t out_frames;
  uint32_t bytes;
  uint local_94;
  mixed_pack *local_90;
  float *target;
  mixed_transfer_function_from local_80;
  void *pack_data;
  SRC_DATA local_70;
  
  plVar2 = (long *)segment->data;
  pmVar3 = (mixed_pack *)*plVar2;
  if (pmVar3->samplerate == *(uint32_t *)(plVar2 + 0xe)) {
    mixed_buffer_from_pack((int)plVar2[0xf],pmVar3,plVar2 + 1,(long)plVar2 + 0x74);
  }
  else {
    bVar1 = pmVar3->channels;
    uVar12 = 0;
    uVar9 = (ulong)(ushort)(0x200 / bVar1);
    target = (float *)(plVar2 + 0x10);
    bVar4 = mixed_samplesize(pmVar3->encoding);
    uVar10 = (uint)bVar1;
    local_80 = mixed_translator_from(pmVar3->encoding);
    local_70.input_frames_used = 0;
    local_70.output_frames_gen = 0;
    local_70.input_frames = 0;
    local_70.output_frames = 0;
    local_70.end_of_input = 0;
    local_70._52_4_ = 0;
    local_70.src_ratio = (double)*(uint *)(plVar2 + 0xe) / (double)pmVar3->samplerate;
    local_70.data_out = (float *)(plVar2 + 0x110);
    local_94 = 0x200 / bVar1;
    local_90 = pmVar3;
    local_70.data_in = (float *)(plVar2 + 0x10);
    do {
      for (; uVar12 != bVar1; uVar12 = uVar12 + 1) {
        uVar6 = mixed_buffer_available_write((mixed_buffer *)plVar2[uVar12 + 1]);
        if (uVar6 <= (uint)uVar9) {
          uVar6 = mixed_buffer_available_write((mixed_buffer *)plVar2[uVar12 + 1]);
          uVar9 = (ulong)uVar6;
        }
      }
      bytes = 0xffffffff;
      local_70.output_frames = uVar9;
      mixed_pack_request_read(&pack_data,&bytes,local_90);
      uVar12 = (ulong)bytes / (ulong)(bVar4 * uVar10);
      if ((uint)uVar9 < (uint)uVar12) {
        uVar12 = uVar9;
      }
      iVar5 = (int)uVar12;
      if (pack_data != (void *)0x0) {
        fVar13 = (*local_80)(pack_data,local_70.data_in,'\x01',iVar5 * uVar10,
                             *(float *)((long)plVar2 + 0x74),*(float *)(plVar2 + 0xf));
        *(float *)((long)plVar2 + 0x74) = fVar13;
        local_70.input_frames = uVar12;
        iVar5 = src_process((SRC_STATE *)plVar2[0xd],&local_70);
        __stream = _stderr;
        if (iVar5 != 0) {
          pcVar7 = src_strerror(iVar5);
          fprintf(__stream,"libsamplerate: %s\n",pcVar7);
          mixed_err(0xf);
          return 0;
        }
        iVar5 = (int)local_70.input_frames_used;
        pfVar11 = local_70.data_out;
        for (uVar9 = 0; uVar9 != bVar1; uVar9 = uVar9 + 1) {
          out_frames = (uint32_t)local_70.output_frames_gen;
          mixed_buffer_request_write(&target,&out_frames,(mixed_buffer *)plVar2[uVar9 + 1]);
          uVar12 = 0;
          for (uVar8 = 0; out_frames != uVar8; uVar8 = uVar8 + 1) {
            target[uVar8] = pfVar11[uVar12];
            uVar12 = (ulong)((int)uVar12 + uVar10);
          }
          pfVar11 = pfVar11 + 1;
          mixed_buffer_finish_write(out_frames,(mixed_buffer *)plVar2[uVar9 + 1]);
        }
        mixed_pack_finish_read(bVar4 * uVar10 * iVar5,local_90);
      }
      uVar12 = 0;
      uVar9 = (ulong)local_94;
    } while (iVar5 != 0);
  }
  return 1;
}

Assistant:

int source_segment_mix(struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  struct mixed_pack *pack = data->pack;

  if(pack->samplerate == data->samplerate){
    mixed_buffer_from_pack(data->pack, data->buffers, &data->volume, data->target_volume);
  }else{
    void *restrict pack_data;
    float *restrict target = data->resample_in;
    mixed_channel_t channels = pack->channels;
    uint32_t frames, buffer_frames = 512 / channels;
    uint32_t frames_to_bytes = channels * mixed_samplesize(pack->encoding);
    mixed_transfer_function_from decoder = mixed_translator_from(pack->encoding);
    SRC_DATA src_data = {0};
    src_data.src_ratio = ((double)data->samplerate)/((double)pack->samplerate);
    src_data.data_in = target;
    src_data.data_out = data->resample_out;
    do{
      // Step 1: determine available space
      frames = buffer_frames;
      for(mixed_channel_t c=0; c<channels; ++c)
        frames = MIN(frames, mixed_buffer_available_write(data->buffers[c]));
      src_data.output_frames = frames;
      // Step 2: unpack to contiguous floats
      uint32_t bytes = UINT32_MAX;
      mixed_pack_request_read(&pack_data, &bytes, pack);
      frames = MIN(frames, bytes / frames_to_bytes);
      if(pack_data){
        data->volume = decoder(pack_data, (float*)src_data.data_in, 1, frames*channels, data->volume, data->target_volume);
        // Step 3: resample
        src_data.input_frames = frames;
        int e = src_process(data->resample_state, &src_data);
        if(e){
          fprintf(stderr, "libsamplerate: %s\n", src_strerror(e));
          mixed_err(MIXED_RESAMPLE_FAILED);
          return 0;
        }
        // Step 4: transfer from contigous to separate buffers
        frames = src_data.input_frames_used;
        float *restrict source = src_data.data_out;
        for(mixed_channel_t c=0; c<channels; ++c){
          uint32_t out_frames = src_data.output_frames_gen;
          mixed_buffer_request_write(&target, &out_frames, data->buffers[c]);
          for(uint32_t i=0; i<out_frames; ++i)
            target[i] = source[i*channels];
          source++;
          mixed_buffer_finish_write(out_frames, data->buffers[c]);
        }
        // Step 5: update consumed samples
        mixed_pack_finish_read(frames * frames_to_bytes, pack);
      }
    }while(frames);
  }
  return 1;
}